

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::init
          (TessCoordComponentInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *code;
  undefined1 in_R9B;
  TransformFeedbackMode local_428;
  allocator<char> local_421;
  string local_420;
  TransformFeedbackVarying local_400;
  string local_3e0;
  ShaderSource local_3c0;
  string local_398;
  ShaderSource local_378;
  string local_350;
  ShaderSource local_330;
  string local_308;
  ShaderSource local_2e8;
  ProgramSources local_2c0;
  SharedPtr<const_glu::ShaderProgram> local_1f0;
  allocator<char> local_1d9;
  string local_1d8 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string tessellationEvaluationTemplate;
  string local_68 [8];
  string tessellationControlTemplate;
  allocator<char> local_31;
  string local_30 [8];
  string vertexShaderTemplate;
  TessCoordComponentInvarianceCase *this_local;
  
  vertexShaderTemplate.field_2._8_8_ = this;
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,(allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_150,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             this->m_winding,this->m_usePointMode & WINDING_CW,(bool)in_R9B);
  std::operator+(&local_130,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&local_150);
  std::operator+(&local_110,&local_130,
                 "\nout highp vec4 in_f_color;\nout highp vec3 out_te_output;\n\nvoid main (void)\n{\n"
                );
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_170,this,"gl_TessCoord.x","out_te_output.x");
  std::operator+(&local_f0,&local_110,&local_170);
  code = "out_te_output.y";
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_190,this,"gl_TessCoord.y");
  std::operator+(&local_d0,&local_f0,&local_190);
  fragmentShaderTemplate.field_2._M_local_buf[0xe] = '\0';
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    code = "out_te_output.z";
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_1b0,this,"gl_TessCoord.z");
  }
  else {
    std::allocator<char>::allocator();
    fragmentShaderTemplate.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"\tout_te_output.z = 0.0f;\n",
               (allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xf));
  }
  std::operator+(&local_b0,&local_d0,&local_1b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,
                 "\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n\tin_f_color = vec4(1.0);\n}\n")
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_1d9);
  std::allocator<char>::~allocator(&local_1d9);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2c0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_308,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_2e8,&local_308);
  pPVar6 = glu::ProgramSources::operator<<(&local_2c0,&local_2e8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_350,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_330,&local_350);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_330);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_398,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_378,&local_398);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_378);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3e0,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3c0,&local_3e0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"out_te_output",&local_421);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_400,&local_420);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_400);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_428,0x8c8c);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_428);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_1f0,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_1f0);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_1f0);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  glu::VertexSource::~VertexSource((VertexSource *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  glu::ProgramSources::~ProgramSources(&local_2c0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (bVar2) {
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_68);
    iVar3 = std::__cxx11::string::~string(local_30);
    return iVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x13bd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessCoordComponentInvarianceCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec3 out_te_output;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tessEvalOutputComponentStatements("gl_TessCoord.x", "out_te_output.x")
												 + tessEvalOutputComponentStatements("gl_TessCoord.y", "out_te_output.y")

												 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
													tessEvalOutputComponentStatements("gl_TessCoord.z", "out_te_output.z") :
													"	out_te_output.z = 0.0f;\n") +
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_output")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}